

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNVarInRangeBase::fold_constants(CTPNVarInRangeBase *this,CTcPrsSymtab *symtab)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  
  pp_Var1 = in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  in_RDI[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  if (in_RDI[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
    in_RDI[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNVarInRangeBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold each element */
    lval_ = lval_->fold_constants(symtab);
    from_expr_ = from_expr_->fold_constants(symtab);
    to_expr_ = to_expr_->fold_constants(symtab);
    if (step_expr_ != 0)
        step_expr_ = step_expr_->fold_constants(symtab);

    /* we can't fold the overall 'in' expression itself */
    return this;
}